

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Throw.cpp
# Opt level: O2

void Js::Throw::StackOverflow(ScriptContext *scriptContext,PVOID returnAddress)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 *in_FS_OFFSET;
  
  if (Configuration::Global[0x23441] == '\x01') {
    Output::Print(L"SystemException: StackOverflow\n");
    Output::Flush();
  }
  bVar3 = JsUtil::ExternalApi::RaiseStackOverflowIfScriptActive(scriptContext,returnAddress);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Exceptions/Throw.cpp"
                         ,0x9a,"(false)","We shouldn\'t be here");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  uVar4 = __cxa_allocate_exception(1);
  __cxa_throw(uVar4,&StackOverflowException::typeinfo,0);
}

Assistant:

void Throw::StackOverflow(ScriptContext *scriptContext, PVOID returnAddress)
    {
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (CONFIG_FLAG(PrintSystemException))
        {
            Output::Print(_u("SystemException: StackOverflow\n"));
            Output::Flush();
        }
#endif
        if (JsUtil::ExternalApi::RaiseStackOverflowIfScriptActive(scriptContext, returnAddress))
        {
            AssertMsg(false, "We shouldn't be here");
        }
        throw StackOverflowException();
    }